

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int http_write(HTTP_INFO *hi,char *data,int len)

{
  int iVar1;
  int iVar2;
  int l;
  int ret;
  char str [10];
  int len_local;
  char *data_local;
  HTTP_INFO *hi_local;
  
  str._2_4_ = len;
  unique0x1000013f = data;
  printf("22222https_write %s \n",data);
  if ((hi == (HTTP_INFO *)0x0) || ((int)str._2_4_ < 1)) {
    hi_local._4_4_ = -1;
  }
  else {
    if ((hi->request).chunked == '\x01') {
      iVar1 = snprintf((char *)((long)&l + 2),10,"%x\r\n",(ulong)(uint)str._2_4_);
      iVar2 = https_write(hi,(char *)((long)&l + 2),iVar1);
      if (iVar2 != iVar1) {
        https_close(hi);
        _error = iVar2;
        return -1;
      }
    }
    iVar1 = https_write(hi,stack0xffffffffffffffe0,str._2_4_);
    if (iVar1 == str._2_4_) {
      if (((hi->request).chunked == '\x01') && (iVar1 = https_write(hi,"\r\n",2), iVar1 != 2)) {
        https_close(hi);
        hi_local._4_4_ = -1;
        _error = iVar1;
      }
      else {
        hi_local._4_1_ = str[2];
        hi_local._5_1_ = str[3];
        hi_local._6_1_ = str[4];
        hi_local._7_1_ = str[5];
      }
    }
    else {
      https_close(hi);
      hi_local._4_4_ = -1;
      _error = iVar1;
    }
  }
  return hi_local._4_4_;
}

Assistant:

int http_write(HTTP_INFO *hi, char *data, int len)
{
printf("22222https_write %s \n", data);
    char        str[10];
    int         ret, l;


    if(NULL == hi || len <= 0) return -1;

    if(hi->request.chunked == TRUE)
    {
        l = snprintf(str, 10, "%x\r\n", len);

        if ((ret = https_write(hi, str, l)) != l)
        {
            https_close(hi);
            _error = ret;

            return -1;
        }
    }

    if((ret = https_write(hi, data, len)) != len)
    {
        https_close(hi);
        _error = ret;

        return -1;
    }

    if(hi->request.chunked == TRUE)
    {
        if ((ret = https_write(hi, "\r\n", 2)) != 2)
        {
            https_close(hi);
            _error = ret;

            return -1;
        }
    }

    return len;
}